

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmString.hxx
# Opt level: O0

type cm::operator<(char **l,String *r)

{
  bool bVar1;
  string_view __x;
  string_view __y;
  String *r_local;
  char **l_local;
  
  __x = AsStringView<char_*>::view(*l);
  __y = String::view(r);
  bVar1 = std::operator<(__x,__y);
  return bVar1;
}

Assistant:

typename std::enable_if<IsComparable<L>::value, bool>::type operator<(
  L&& l, const String& r)
{
  return AsStringView<L>::view(std::forward<L>(l)) < r.view();
}